

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cpp
# Opt level: O1

void InitEval1(void)

{
  int iVar1;
  array<int,_3UL> *paVar2;
  undefined1 *puVar3;
  double (*padVar4) [3];
  int *piVar5;
  int u;
  long lVar6;
  int v;
  long lVar7;
  int *piVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  TBoard board;
  array<int,_3UL> local_54;
  undefined1 local_48 [4];
  int local_44;
  int local_3c;
  int local_34;
  
  lVar9 = 0;
  do {
    makeBoard((TBoard *)&local_54,(short)lVar9);
    dVar10 = 0.0;
    if (g_board_status[lVar9] == '\0') {
      padVar4 = g_eval_micro_matrix1;
      lVar6 = 0;
      paVar2 = &local_54;
      do {
        lVar7 = 0;
        do {
          iVar1 = ((array<int,_3UL> *)paVar2->_M_elems)->_M_elems[lVar7];
          if (iVar1 != 0) {
            dVar10 = dVar10 + (double)(iVar1 * -2 + 3) * (*padVar4)[lVar7];
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        lVar6 = lVar6 + 1;
        padVar4 = padVar4 + 1;
        paVar2 = paVar2 + 1;
      } while (lVar6 != 3);
      piVar5 = local_54._M_elems + 1;
      lVar6 = 0;
      puVar3 = local_48;
      do {
        lVar7 = -3;
        piVar8 = piVar5;
        do {
          iVar1 = ((array<int,_3UL> *)(piVar8 + -1))->_M_elems[0];
          if ((iVar1 != 0) && (iVar1 == *piVar8)) {
            dVar11 = (double)(iVar1 * -2 + 3);
            dVar10 = dVar10 + dVar11 + dVar11;
          }
          iVar1 = *(int *)(puVar3 + lVar7 * 4);
          if ((iVar1 != 0) && (iVar1 == *(int *)(puVar3 + lVar7 * 4 + 0xc))) {
            dVar11 = (double)(iVar1 * -2 + 3);
            dVar10 = dVar10 + dVar11 + dVar11;
          }
          piVar8 = piVar8 + 1;
          lVar7 = lVar7 + 3;
        } while (lVar7 == 0);
        lVar6 = lVar6 + 1;
        piVar5 = piVar5 + 3;
        puVar3 = puVar3 + 4;
      } while (lVar6 != 3);
      if (local_44 != 0) {
        if ((local_44 == local_54._M_elems[0]) || (local_44 == local_34)) {
          dVar11 = (double)(local_44 * -2 + 3);
          dVar10 = dVar10 + dVar11 + dVar11;
        }
        if ((local_44 == local_3c) || (local_44 == local_54._M_elems[2])) {
          dVar11 = (double)(local_44 * -2 + 3);
          dVar10 = dVar10 + dVar11 + dVar11;
        }
      }
    }
    g_eval_micro1[lVar9] = dVar10;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x4ce3);
  lVar9 = 0;
  do {
    makeBoard4((TBoard *)&local_54,(int)lVar9);
    dVar10 = 0.0;
    padVar4 = g_eval_macro_matrix1;
    lVar6 = 0;
    paVar2 = &local_54;
    do {
      lVar7 = 0;
      do {
        iVar1 = ((array<int,_3UL> *)paVar2->_M_elems)->_M_elems[lVar7];
        if (iVar1 - 1U < 2) {
          dVar10 = dVar10 + (double)(iVar1 * -2 + 3) * (*padVar4)[lVar7];
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      lVar6 = lVar6 + 1;
      padVar4 = padVar4 + 1;
      paVar2 = paVar2 + 1;
    } while (lVar6 != 3);
    lVar6 = 0;
    puVar3 = local_48;
    piVar5 = local_54._M_elems + 1;
    do {
      lVar7 = -3;
      piVar8 = piVar5;
      do {
        iVar1 = ((array<int,_3UL> *)(piVar8 + -1))->_M_elems[0];
        if ((iVar1 != 0) && (iVar1 == *piVar8)) {
          dVar10 = dVar10 + (double)(iVar1 * -2 + 3) * 15.0;
        }
        iVar1 = *(int *)(puVar3 + lVar7 * 4);
        if ((iVar1 != 0) && (iVar1 == *(int *)(puVar3 + lVar7 * 4 + 0xc))) {
          dVar10 = dVar10 + (double)(iVar1 * -2 + 3) * 15.0;
        }
        piVar8 = piVar8 + 1;
        lVar7 = lVar7 + 3;
      } while (lVar7 == 0);
      lVar6 = lVar6 + 1;
      piVar5 = piVar5 + 3;
      puVar3 = puVar3 + 4;
    } while (lVar6 != 3);
    if (local_44 - 1U < 2) {
      if ((local_44 == local_54._M_elems[0]) || (local_44 == local_34)) {
        dVar10 = dVar10 + (double)(local_44 * -2 + 3) * 15.0;
      }
      if ((local_44 == local_3c) || (local_44 == local_54._M_elems[2])) {
        dVar10 = dVar10 + (double)(local_44 * -2 + 3) * 15.0;
      }
    }
    g_eval_macro1[lVar9] = dVar10;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x40000);
  return;
}

Assistant:

void
InitEval1()
{
    for (short i = 0; i < 19683; i++)
    {
        double points = 0.0;
        auto board = makeBoard(i);
        if (g_board_status[i] == 0)
        {
            for (int u = 0; u < 3; ++u)
                for (int v = 0; v < 3; ++v)
                    if (board[u][v] != 0)
                        points += (-2 * board[u][v] + 3) * g_eval_micro_matrix1[u][v];
            for (int u = 0; u < 3; ++u)
                for (int v = 0; v < 2; ++v)
                {
                    if (board[u][v] == board[u][v + 1] && board[u][v] != 0)
                        points += (-2 * board[u][v] + 3) * g_micro_double_bonus1;
                    if (board[v][u] == board[v + 1][u] && board[v][u] != 0)
                        points += (-2 * board[v][u] + 3) * g_micro_double_bonus1;
                }
            if (board[1][1] != 0)
            {
                if (board[1][1] == board[0][0] || board[1][1] == board[2][2])
                    points += (-2 * board[1][1] + 3) * g_micro_double_bonus1;
                if (board[1][1] == board[2][0] || board[1][1] == board[0][2])
                    points += (-2 * board[1][1] + 3) * g_micro_double_bonus1;
            }
        }
        g_eval_micro1[i] = points;
    }

    for (int i = 0; i < 262144; i++)
    {
        double points = 0.0;
        auto board = makeBoard4(i);
        for (int u = 0; u < 3; ++u)
            for (int v = 0; v < 3; ++v)
                if (board[u][v] == 1 || board[u][v] == 2)
                    points += (-2 * board[u][v] + 3) * g_eval_macro_matrix1[u][v];
        for (int u = 0; u < 3; ++u)
            for (int v = 0; v < 2; ++v)
            {
                if (board[u][v] == board[u][v + 1] && board[u][v] != 0)
                    points += (-2 * board[u][v] + 3) * g_macro_double_bonus1;
                if (board[v][u] == board[v + 1][u] && board[v][u] != 0)
                    points += (-2 * board[v][u] + 3) * g_macro_double_bonus1;
            }
        if (board[1][1] == 1 || board[1][1] == 2)
        {
            if (board[1][1] == board[0][0] || board[1][1] == board[2][2])
                points += (-2 * board[1][1] + 3) * g_macro_double_bonus1;
            if (board[1][1] == board[2][0] || board[1][1] == board[0][2])
                points += (-2 * board[1][1] + 3) * g_macro_double_bonus1;
        }
        g_eval_macro1[i] = points;
    }
}